

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall google::protobuf::io::CordInputStream::LoadChunkData(CordInputStream *this)

{
  const_pointer pvVar1;
  size_type sVar2;
  bool bVar3;
  undefined1 local_28 [8];
  string_view sv;
  CordInputStream *this_local;
  
  bVar3 = this->bytes_remaining_ == 0;
  if (bVar3) {
    this->available_ = 0;
    this->size_ = 0;
  }
  else {
    sv._M_str = (char *)this;
    _local_28 = absl::lts_20240722::Cord::ChunkRemaining(&this->it_);
    pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_28);
    this->data_ = pvVar1;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_28);
    this->available_ = sVar2;
    this->size_ = sVar2;
  }
  this_local._7_1_ = !bVar3;
  return this_local._7_1_;
}

Assistant:

bool CordInputStream::LoadChunkData() {
  if (bytes_remaining_ != 0) {
    absl::string_view sv = absl::Cord::ChunkRemaining(it_);
    data_ = sv.data();
    size_ = available_ = sv.size();
    return true;
  }
  size_ = available_ = 0;
  return false;
}